

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<int,4,1,0,4,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,int>,Eigen::Matrix<int,4,1,0,4,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,4,1,0,4,1>const>const>,Eigen::internal::assign_op<int,int>>
               (Matrix<int,_4,_1,_0,_4,_1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
               *src,assign_op<int,_int> *func)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  DstEvaluatorType local_40;
  SrcEvaluatorType local_38;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>,_Eigen::internal::assign_op<int,_int>,_0>
  local_20;
  
  local_38.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_int,_int>
  .m_d.lhsImpl.super_evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>.m_d.data =
       (evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>)src->m_lhs;
  local_20.m_src = &local_38;
  local_38.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_int,_int>
  .m_d.rhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
  .m_functor.m_other = (src->m_rhs).m_functor.m_other;
  local_20.m_dst = &local_40;
  local_40.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>)
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>)dst;
  local_20.m_functor = func;
  local_20.m_dstExpr = dst;
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>,_Eigen::internal::assign_op<int,_int>,_0>,_0,_4>
  ::run(&local_20);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}